

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_func_setup(jit_State *J)

{
  byte bVar1;
  GCproto *pGVar2;
  TraceError e;
  ulong uVar3;
  
  pGVar2 = J->pt;
  if ((pGVar2->flags & 8) == 0) {
    if ((uint)pGVar2->framesize + J->baseslot < 0xfa) {
      bVar1 = pGVar2->numparams;
      for (uVar3 = (ulong)J->maxslot; uVar3 < bVar1; uVar3 = uVar3 + 1) {
        J->base[uVar3] = 0x7fff;
      }
      J->maxslot = (uint)bVar1;
      return;
    }
    e = LJ_TRERR_STACKOV;
  }
  else {
    e = LJ_TRERR_CJITOFF;
  }
  lj_trace_err(J,e);
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}